

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined4 uVar79;
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar80 [64];
  undefined1 auVar49 [32];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar28 = uVar5 * sVar8;
  lVar27 = (uVar5 + 1) * sVar8;
  lVar26 = (uVar5 + 2) * sVar8;
  lVar25 = (uVar5 + 3) * sVar8;
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar64 = *(undefined4 *)(pcVar7 + lVar28 + 8);
  auVar29._4_4_ = uVar64;
  auVar29._0_4_ = uVar64;
  auVar29._8_4_ = uVar64;
  auVar29._12_4_ = uVar64;
  auVar29 = vmulps_avx512vl((undefined1  [16])aVar4,auVar29);
  uVar64 = *(undefined4 *)(pcVar7 + lVar28 + 4);
  auVar30._4_4_ = uVar64;
  auVar30._0_4_ = uVar64;
  auVar30._8_4_ = uVar64;
  auVar30._12_4_ = uVar64;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar3,auVar30);
  uVar64 = *(undefined4 *)(pcVar7 + lVar28);
  auVar31._4_4_ = uVar64;
  auVar31._0_4_ = uVar64;
  auVar31._8_4_ = uVar64;
  auVar31._12_4_ = uVar64;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar2,auVar31);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar12 = fVar1 * *(float *)(pcVar7 + lVar28 + 0xc);
  uVar64 = *(undefined4 *)(pcVar7 + lVar27 + 8);
  auVar32._4_4_ = uVar64;
  auVar32._0_4_ = uVar64;
  auVar32._8_4_ = uVar64;
  auVar32._12_4_ = uVar64;
  auVar30 = vmulps_avx512vl((undefined1  [16])aVar4,auVar32);
  uVar64 = *(undefined4 *)(pcVar7 + lVar27 + 4);
  auVar33._4_4_ = uVar64;
  auVar33._0_4_ = uVar64;
  auVar33._8_4_ = uVar64;
  auVar33._12_4_ = uVar64;
  auVar30 = vfmadd231ps_avx512vl(auVar30,(undefined1  [16])aVar3,auVar33);
  uVar64 = *(undefined4 *)(pcVar7 + lVar27);
  auVar11._4_4_ = uVar64;
  auVar11._0_4_ = uVar64;
  auVar11._8_4_ = uVar64;
  auVar11._12_4_ = uVar64;
  auVar30 = vfmadd231ps_avx512vl(auVar30,(undefined1  [16])aVar2,auVar11);
  fVar13 = fVar1 * *(float *)(pcVar7 + lVar27 + 0xc);
  uVar64 = *(undefined4 *)(pcVar7 + lVar26 + 8);
  auVar38._4_4_ = uVar64;
  auVar38._0_4_ = uVar64;
  auVar38._8_4_ = uVar64;
  auVar38._12_4_ = uVar64;
  auVar31 = vmulps_avx512vl((undefined1  [16])aVar4,auVar38);
  uVar64 = *(undefined4 *)(pcVar7 + lVar26 + 4);
  auVar37._4_4_ = uVar64;
  auVar37._0_4_ = uVar64;
  auVar37._8_4_ = uVar64;
  auVar37._12_4_ = uVar64;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar3,auVar37);
  uVar64 = *(undefined4 *)(pcVar7 + lVar26);
  auVar34._4_4_ = uVar64;
  auVar34._0_4_ = uVar64;
  auVar34._8_4_ = uVar64;
  auVar34._12_4_ = uVar64;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar2,auVar34);
  fVar14 = fVar1 * *(float *)(pcVar7 + lVar26 + 0xc);
  uVar64 = *(undefined4 *)(pcVar7 + lVar25 + 8);
  auVar35._4_4_ = uVar64;
  auVar35._0_4_ = uVar64;
  auVar35._8_4_ = uVar64;
  auVar35._12_4_ = uVar64;
  auVar32 = vmulps_avx512vl((undefined1  [16])aVar4,auVar35);
  uVar64 = *(undefined4 *)(pcVar7 + lVar25 + 4);
  auVar36._4_4_ = uVar64;
  auVar36._0_4_ = uVar64;
  auVar36._8_4_ = uVar64;
  auVar36._12_4_ = uVar64;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar3,auVar36);
  uVar64 = *(undefined4 *)(pcVar7 + lVar25);
  auVar18._4_4_ = uVar64;
  auVar18._0_4_ = uVar64;
  auVar18._8_4_ = uVar64;
  auVar18._12_4_ = uVar64;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar2,auVar18);
  auVar33 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar7 + lVar25 + 0xc)));
  uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar23 = (ulong)uVar5;
  uVar74 = auVar31._0_4_;
  uVar64 = auVar29._0_4_;
  uVar79 = auVar30._0_4_;
  if (uVar23 == 4) {
    auVar59._4_4_ = fVar14;
    auVar59._0_4_ = fVar14;
    auVar59._8_4_ = fVar14;
    auVar59._12_4_ = fVar14;
    auVar11 = vblendps_avx(auVar31,auVar59,8);
    auVar67._4_4_ = uVar64;
    auVar67._0_4_ = uVar64;
    auVar67._8_4_ = uVar64;
    auVar67._12_4_ = uVar64;
    auVar38 = vshufps_avx(auVar29,auVar29,0x55);
    auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
    auVar65._4_4_ = fVar12;
    auVar65._0_4_ = fVar12;
    auVar65._8_4_ = fVar12;
    auVar65._12_4_ = fVar12;
    auVar73._4_4_ = uVar79;
    auVar73._0_4_ = uVar79;
    auVar73._8_4_ = uVar79;
    auVar73._12_4_ = uVar79;
    auVar37 = vshufps_avx(auVar30,auVar30,0x55);
    auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
    auVar70._4_4_ = fVar13;
    auVar70._0_4_ = fVar13;
    auVar70._8_4_ = fVar13;
    auVar70._12_4_ = fVar13;
    auVar77._4_4_ = uVar74;
    auVar77._0_4_ = uVar74;
    auVar77._8_4_ = uVar74;
    auVar77._12_4_ = uVar74;
    auVar34 = vshufps_avx512vl(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar35 = vbroadcastss_avx512vl(auVar32);
    auVar36 = vshufps_avx512vl(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar33 = vbroadcastss_avx512vl(auVar33);
    auVar35 = vmulps_avx512vl(auVar35,catmullrom_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,catmullrom_basis0._3740_16_);
    auVar32 = vmulps_avx512vl(auVar32,catmullrom_basis0._3740_16_);
    auVar33 = vmulps_avx512vl(auVar33,catmullrom_basis0._3740_16_);
    auVar35 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._2584_16_,auVar77);
    auVar34 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._2584_16_,auVar34);
    auVar31 = vfmadd231ps_fma(auVar32,catmullrom_basis0._2584_16_,auVar31);
    auVar32 = vfmadd231ps_avx512vl(auVar33,auVar59,catmullrom_basis0._2584_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar35,catmullrom_basis0._1428_16_,auVar73);
    auVar37 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._1428_16_,auVar37);
    auVar30 = vfmadd231ps_fma(auVar31,catmullrom_basis0._1428_16_,auVar30);
    auVar31 = vfmadd231ps_avx512vl(auVar32,catmullrom_basis0._1428_16_,auVar70);
    auVar34 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._272_16_,auVar67);
    auVar38 = vfmadd231ps_avx512vl(auVar37,catmullrom_basis0._272_16_,auVar38);
    auVar33 = vfmadd231ps_fma(auVar30,catmullrom_basis0._272_16_,auVar29);
    auVar37 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._272_16_,auVar65);
    auVar35 = vshufps_avx512vl(auVar34,auVar34,0xb1);
    auVar30 = vminps_avx512vl(auVar35,auVar34);
    auVar29 = vshufpd_avx(auVar30,auVar30,1);
    auVar29 = vminps_avx(auVar29,auVar30);
    auVar36 = vshufps_avx512vl(auVar38,auVar38,0xb1);
    auVar31 = vminps_avx512vl(auVar36,auVar38);
    auVar30 = vshufpd_avx(auVar31,auVar31,1);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar29 = vinsertps_avx(auVar29,auVar30,0x1c);
    auVar32 = vshufps_avx(auVar33,auVar33,0xb1);
    auVar30 = vminps_avx(auVar32,auVar33);
    auVar31 = vshufpd_avx(auVar30,auVar30,1);
    auVar30 = vminps_avx(auVar31,auVar30);
    auVar29 = vinsertps_avx(auVar29,auVar30,0x20);
    auVar31 = vmaxps_avx512vl(auVar35,auVar34);
    auVar30 = vshufpd_avx(auVar31,auVar31,1);
    auVar30 = vmaxps_avx(auVar30,auVar31);
    auVar38 = vmaxps_avx512vl(auVar36,auVar38);
    auVar31 = vshufpd_avx(auVar38,auVar38,1);
    auVar31 = vmaxps_avx(auVar31,auVar38);
    auVar30 = vinsertps_avx(auVar30,auVar31,0x1c);
    auVar31 = vmaxps_avx(auVar32,auVar33);
    auVar32 = vshufpd_avx(auVar31,auVar31,1);
    auVar31 = vmaxps_avx(auVar32,auVar31);
    auVar30 = vinsertps_avx(auVar30,auVar31,0x20);
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar37,auVar19);
    auVar32 = vprolq_avx512vl(auVar31,0x20);
    auVar31 = vmaxps_avx(auVar32,auVar31);
    uVar64 = auVar31._0_4_;
    auVar68._4_4_ = uVar64;
    auVar68._0_4_ = uVar64;
    auVar68._8_4_ = uVar64;
    auVar68._12_4_ = uVar64;
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar31 = vmaxps_avx(auVar31,auVar68);
    auVar29 = vminps_avx(auVar29,auVar11);
    auVar30 = vmaxps_avx(auVar30,auVar11);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar59,auVar20);
    auVar63 = vmaxps_avx(auVar31,auVar32);
    auVar29 = vsubps_avx(auVar29,auVar63);
  }
  else {
    if ((int)uVar5 < 0) {
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar29 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar52 = ZEXT1632(auVar29);
      auVar54 = auVar53;
      auVar40 = auVar53;
      auVar50 = auVar55;
      auVar51 = auVar55;
    }
    else {
      auVar39 = vpbroadcastd_avx512vl();
      auVar78._8_4_ = 1;
      auVar78._0_8_ = 0x100000001;
      auVar78._12_4_ = 1;
      auVar78._16_4_ = 1;
      auVar78._20_4_ = 1;
      auVar78._24_4_ = 1;
      auVar78._28_4_ = 1;
      auVar58 = vpermps_avx2(auVar78,ZEXT1632(auVar29));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar41 = vpermps_avx512vl(auVar40,ZEXT1632(auVar29));
      auVar66._4_4_ = fVar12;
      auVar66._0_4_ = fVar12;
      auVar66._8_4_ = fVar12;
      auVar66._12_4_ = fVar12;
      auVar66._16_4_ = fVar12;
      auVar66._20_4_ = fVar12;
      auVar66._24_4_ = fVar12;
      auVar66._28_4_ = fVar12;
      auVar69._4_4_ = uVar79;
      auVar69._0_4_ = uVar79;
      auVar69._8_4_ = uVar79;
      auVar69._12_4_ = uVar79;
      auVar69._16_4_ = uVar79;
      auVar69._20_4_ = uVar79;
      auVar69._24_4_ = uVar79;
      auVar69._28_4_ = uVar79;
      auVar15 = vpermps_avx2(auVar78,ZEXT1632(auVar30));
      auVar42 = vpermps_avx512vl(auVar40,ZEXT1632(auVar30));
      auVar71._4_4_ = fVar13;
      auVar71._0_4_ = fVar13;
      auVar71._8_4_ = fVar13;
      auVar71._12_4_ = fVar13;
      auVar71._16_4_ = fVar13;
      auVar71._20_4_ = fVar13;
      auVar71._24_4_ = fVar13;
      auVar71._28_4_ = fVar13;
      auVar72._4_4_ = uVar74;
      auVar72._0_4_ = uVar74;
      auVar72._8_4_ = uVar74;
      auVar72._12_4_ = uVar74;
      auVar72._16_4_ = uVar74;
      auVar72._20_4_ = uVar74;
      auVar72._24_4_ = uVar74;
      auVar72._28_4_ = uVar74;
      auVar16 = vpermps_avx2(auVar78,ZEXT1632(auVar31));
      auVar43 = vpermps_avx512vl(auVar40,ZEXT1632(auVar31));
      auVar75._4_4_ = fVar14;
      auVar75._0_4_ = fVar14;
      auVar75._8_4_ = fVar14;
      auVar75._12_4_ = fVar14;
      auVar75._16_4_ = fVar14;
      auVar75._20_4_ = fVar14;
      auVar75._24_4_ = fVar14;
      auVar75._28_4_ = fVar14;
      uVar79 = auVar32._0_4_;
      auVar76._4_4_ = uVar79;
      auVar76._0_4_ = uVar79;
      auVar76._8_4_ = uVar79;
      auVar76._12_4_ = uVar79;
      auVar76._16_4_ = uVar79;
      auVar76._20_4_ = uVar79;
      auVar76._24_4_ = uVar79;
      auVar76._28_4_ = uVar79;
      auVar78 = vpermps_avx2(auVar78,ZEXT1632(auVar32));
      auVar44 = vpermps_avx512vl(auVar40,ZEXT1632(auVar32));
      auVar45 = vbroadcastss_avx512vl(auVar33);
      lVar25 = uVar23 * 0x44;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar29 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar80 = ZEXT1664(auVar29);
      uVar24 = 0;
      auVar57 = auVar47;
      auVar22 = auVar46;
      auVar48 = auVar46;
      auVar49 = auVar47;
      do {
        auVar40 = vpbroadcastd_avx512vl();
        auVar50 = vpord_avx512vl(auVar40,_DAT_0205a920);
        auVar40 = *(undefined1 (*) [32])(catmullrom_basis0 + uVar24 * 4 + lVar25);
        auVar55 = *(undefined1 (*) [32])(lVar25 + 0x22307f0 + uVar24 * 4);
        auVar54 = *(undefined1 (*) [32])(lVar25 + 0x2230c74 + uVar24 * 4);
        uVar17 = vpcmpgtd_avx512vl(auVar50,auVar39);
        auVar50 = *(undefined1 (*) [32])(lVar25 + 0x22310f8 + uVar24 * 4);
        auVar51 = vmulps_avx512vl(auVar76,auVar50);
        auVar52 = vmulps_avx512vl(auVar78,auVar50);
        auVar53 = vmulps_avx512vl(auVar44,auVar50);
        auVar50 = vmulps_avx512vl(auVar45,auVar50);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar54,auVar72);
        auVar52 = vfmadd231ps_avx512vl(auVar52,auVar54,auVar16);
        auVar53 = vfmadd231ps_avx512vl(auVar53,auVar54,auVar43);
        auVar54 = vfmadd231ps_avx512vl(auVar50,auVar75,auVar54);
        auVar50 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar69);
        auVar51 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar15);
        auVar52 = vfmadd231ps_avx512vl(auVar53,auVar55,auVar42);
        auVar55 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar55);
        auVar56._4_4_ = uVar64;
        auVar56._0_4_ = uVar64;
        auVar56._8_4_ = uVar64;
        auVar56._12_4_ = uVar64;
        auVar56._16_4_ = uVar64;
        auVar56._20_4_ = uVar64;
        auVar56._24_4_ = uVar64;
        auVar56._28_4_ = uVar64;
        auVar54 = vfmadd231ps_avx512vl(auVar50,auVar40,auVar56);
        auVar53 = vfmadd231ps_avx512vl(auVar51,auVar40,auVar58);
        auVar52 = vfmadd231ps_avx512vl(auVar52,auVar40,auVar41);
        auVar56 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar40);
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar21._16_4_ = 0x7fffffff;
        auVar21._20_4_ = 0x7fffffff;
        auVar21._24_4_ = 0x7fffffff;
        auVar21._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar56,auVar21);
        auVar40 = vminps_avx512vl(auVar49,auVar54);
        bVar9 = (byte)uVar17;
        auVar50._0_4_ = (uint)(bVar9 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar40._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar10 * auVar49._4_4_ | (uint)!bVar10 * auVar40._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar10 * auVar49._8_4_ | (uint)!bVar10 * auVar40._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar10 * auVar49._12_4_ | (uint)!bVar10 * auVar40._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar10 * auVar49._16_4_ | (uint)!bVar10 * auVar40._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * auVar40._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar10 * auVar49._24_4_ | (uint)!bVar10 * auVar40._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar50._28_4_ = (uint)bVar10 * auVar49._28_4_ | (uint)!bVar10 * auVar40._28_4_;
        auVar40 = vminps_avx512vl(auVar57,auVar53);
        auVar55._0_4_ = (uint)(bVar9 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar40._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar10 * auVar57._4_4_ | (uint)!bVar10 * auVar40._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar10 * auVar57._8_4_ | (uint)!bVar10 * auVar40._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar10 * auVar57._12_4_ | (uint)!bVar10 * auVar40._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar10 * auVar57._16_4_ | (uint)!bVar10 * auVar40._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar10 * auVar57._20_4_ | (uint)!bVar10 * auVar40._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar10 * auVar57._24_4_ | (uint)!bVar10 * auVar40._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar55._28_4_ = (uint)bVar10 * auVar57._28_4_ | (uint)!bVar10 * auVar40._28_4_;
        auVar40 = vminps_avx512vl(auVar47,auVar52);
        auVar51._0_4_ = (uint)(bVar9 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar40._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar10 * auVar47._4_4_ | (uint)!bVar10 * auVar40._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar10 * auVar47._8_4_ | (uint)!bVar10 * auVar40._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * auVar40._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar10 * auVar47._16_4_ | (uint)!bVar10 * auVar40._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar10 * auVar47._20_4_ | (uint)!bVar10 * auVar40._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar10 * auVar47._24_4_ | (uint)!bVar10 * auVar40._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar51._28_4_ = (uint)bVar10 * auVar47._28_4_ | (uint)!bVar10 * auVar40._28_4_;
        auVar40 = vmaxps_avx512vl(auVar48,auVar54);
        auVar54._0_4_ = (uint)(bVar9 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar40._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar10 * auVar48._4_4_ | (uint)!bVar10 * auVar40._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar10 * auVar48._8_4_ | (uint)!bVar10 * auVar40._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar10 * auVar48._12_4_ | (uint)!bVar10 * auVar40._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar10 * auVar48._16_4_ | (uint)!bVar10 * auVar40._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar10 * auVar48._20_4_ | (uint)!bVar10 * auVar40._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar10 * auVar48._24_4_ | (uint)!bVar10 * auVar40._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar54._28_4_ = (uint)bVar10 * auVar48._28_4_ | (uint)!bVar10 * auVar40._28_4_;
        auVar53 = vmaxps_avx512vl(auVar22,auVar53);
        auVar40._0_4_ = (uint)(bVar9 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar53._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar10 * auVar22._4_4_ | (uint)!bVar10 * auVar53._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar10 * auVar22._8_4_ | (uint)!bVar10 * auVar53._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar10 * auVar22._12_4_ | (uint)!bVar10 * auVar53._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar10 * auVar22._16_4_ | (uint)!bVar10 * auVar53._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar10 * auVar22._20_4_ | (uint)!bVar10 * auVar53._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar10 * auVar22._24_4_ | (uint)!bVar10 * auVar53._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar40._28_4_ = (uint)bVar10 * auVar22._28_4_ | (uint)!bVar10 * auVar53._28_4_;
        auVar52 = vmaxps_avx512vl(auVar46,auVar52);
        auVar53._0_4_ = (uint)(bVar9 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar52._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar10 * auVar46._4_4_ | (uint)!bVar10 * auVar52._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar10 * auVar46._8_4_ | (uint)!bVar10 * auVar52._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar10 * auVar46._12_4_ | (uint)!bVar10 * auVar52._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar10 * auVar46._16_4_ | (uint)!bVar10 * auVar52._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar10 * auVar46._20_4_ | (uint)!bVar10 * auVar52._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * auVar52._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar53._28_4_ = (uint)bVar10 * auVar46._28_4_ | (uint)!bVar10 * auVar52._28_4_;
        auVar57 = vmaxps_avx512vl(auVar80._0_32_,auVar56);
        auVar52._0_4_ = (uint)(bVar9 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar57._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar10 * auVar80._4_4_ | (uint)!bVar10 * auVar57._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar10 * auVar80._8_4_ | (uint)!bVar10 * auVar57._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar10 * auVar80._12_4_ | (uint)!bVar10 * auVar57._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar10 * auVar80._16_4_ | (uint)!bVar10 * auVar57._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar10 * auVar80._20_4_ | (uint)!bVar10 * auVar57._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar10 * auVar80._24_4_ | (uint)!bVar10 * auVar57._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar52._28_4_ = (uint)bVar10 * auVar80._28_4_ | (uint)!bVar10 * auVar57._28_4_;
        uVar24 = uVar24 + 8;
        auVar80 = ZEXT3264(auVar52);
        auVar47 = auVar51;
        auVar46 = auVar53;
        auVar57 = auVar55;
        auVar22 = auVar40;
        auVar48 = auVar54;
        auVar49 = auVar50;
      } while (uVar24 <= uVar23);
    }
    auVar58 = vshufps_avx512vl(auVar50,auVar50,0xb1);
    auVar58 = vminps_avx512vl(auVar50,auVar58);
    auVar50 = vshufpd_avx(auVar58,auVar58,5);
    auVar50 = vminps_avx(auVar58,auVar50);
    auVar29 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
    auVar50 = vshufps_avx512vl(auVar55,auVar55,0xb1);
    auVar50 = vminps_avx512vl(auVar55,auVar50);
    auVar55 = vshufpd_avx(auVar50,auVar50,5);
    auVar55 = vminps_avx(auVar50,auVar55);
    auVar30 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar30 = vunpcklps_avx(auVar29,auVar30);
    auVar55 = vshufps_avx512vl(auVar51,auVar51,0xb1);
    auVar50 = vminps_avx512vl(auVar51,auVar55);
    auVar55 = vshufpd_avx(auVar50,auVar50,5);
    auVar55 = vminps_avx(auVar50,auVar55);
    auVar29 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar29 = vinsertps_avx(auVar30,auVar29,0x28);
    auVar55 = vshufps_avx512vl(auVar54,auVar54,0xb1);
    auVar54 = vmaxps_avx512vl(auVar54,auVar55);
    auVar55 = vshufpd_avx(auVar54,auVar54,5);
    auVar55 = vmaxps_avx(auVar54,auVar55);
    auVar30 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar55 = vshufps_avx512vl(auVar40,auVar40,0xb1);
    auVar55 = vmaxps_avx512vl(auVar40,auVar55);
    auVar40 = vshufpd_avx(auVar55,auVar55,5);
    auVar40 = vmaxps_avx(auVar55,auVar40);
    auVar31 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar31 = vunpcklps_avx(auVar30,auVar31);
    auVar40 = vshufps_avx512vl(auVar53,auVar53,0xb1);
    auVar55 = vmaxps_avx512vl(auVar53,auVar40);
    auVar40 = vshufpd_avx(auVar55,auVar55,5);
    auVar40 = vmaxps_avx(auVar55,auVar40);
    auVar30 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar30 = vinsertps_avx(auVar31,auVar30,0x28);
    auVar40 = vshufps_avx512vl(auVar52,auVar52,0xb1);
    auVar55 = vmaxps_avx512vl(auVar52,auVar40);
    auVar40 = vshufpd_avx(auVar55,auVar55,5);
    auVar40 = vmaxps_avx(auVar55,auVar40);
    auVar31 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar63._0_4_ = auVar31._0_4_;
    auVar63._4_4_ = auVar63._0_4_;
    auVar63._8_4_ = auVar63._0_4_;
    auVar63._12_4_ = auVar63._0_4_;
    auVar29 = vsubps_avx(auVar29,auVar63);
  }
  auVar60._0_4_ = auVar30._0_4_ + auVar63._0_4_;
  auVar60._4_4_ = auVar30._4_4_ + auVar63._4_4_;
  auVar60._8_4_ = auVar30._8_4_ + auVar63._8_4_;
  auVar60._12_4_ = auVar30._12_4_ + auVar63._12_4_;
  auVar61._8_4_ = 0x7fffffff;
  auVar61._0_8_ = 0x7fffffff7fffffff;
  auVar61._12_4_ = 0x7fffffff;
  auVar30 = vandps_avx(auVar29,auVar61);
  auVar31 = vandps_avx(auVar60,auVar61);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vmovshdup_avx(auVar30);
  auVar31 = vmaxss_avx(auVar31,auVar30);
  auVar30 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vmaxss_avx(auVar30,auVar31);
  fVar1 = auVar30._0_4_ * 4.7683716e-07;
  auVar62._4_4_ = fVar1;
  auVar62._0_4_ = fVar1;
  auVar62._8_4_ = fVar1;
  auVar62._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar29,auVar62);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar60._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar60._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar60._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar60._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }